

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.cpp
# Opt level: O0

string * cappuccino::to_string_abi_cxx11_(thread_safe ts)

{
  undefined1 *puStack_10;
  thread_safe ts_local;
  
  if (ts == no) {
    puStack_10 = thread_safe_no_abi_cxx11_;
  }
  else if (ts == yes) {
    puStack_10 = thread_safe_yes_abi_cxx11_;
  }
  else {
    puStack_10 = thread_safe_invalid_value_abi_cxx11_;
  }
  return (string *)puStack_10;
}

Assistant:

auto to_string(thread_safe ts) -> const std::string&
{
    switch (ts)
    {
        case thread_safe::no:
            return thread_safe_no;
        case thread_safe::yes:
            return thread_safe_yes;
        default:
            return thread_safe_invalid_value;
    }
}